

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astcenc_partition_tables.cpp
# Opt level: O3

void build_partition_table_for_one_partition_count
               (block_size_descriptor *bsd,bool can_omit_partitionings,uint partition_count_cutoff,
               uint partition_count,partition_info *ptab,uint64_t *canonical_patterns)

{
  uint64_t *puVar1;
  byte bVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  uint i;
  long lVar6;
  undefined7 in_register_00000031;
  byte bVar7;
  ulong uVar8;
  ulong uVar9;
  int iVar10;
  ulong uVar11;
  uint partition_remap_index;
  ulong uVar12;
  uint x;
  int iVar13;
  bool bVar14;
  bool bVar15;
  uint8_t build [1024];
  int local_46c;
  undefined1 local_448 [16];
  char local_438 [1032];
  
  uVar4 = partition_count - 1;
  partition_remap_index = 0;
  bsd->partitioning_count_selected[uVar4] = 0;
  bsd->partitioning_count_all[uVar4] = 0;
  local_46c = 2;
  if (((int)CONCAT71(in_register_00000031,can_omit_partitionings) == 0) ||
     (local_46c = 1, partition_count <= partition_count_cutoff)) {
    memset(local_438,0,0x400);
    iVar13 = 0;
    do {
      lVar6 = 0;
      do {
        if (iVar13 == 1) {
          if (local_438[lVar6] == '\0') {
            bVar3 = generate_one_partition_info_entry
                              (bsd,partition_count,(uint)lVar6,partition_remap_index,
                               ptab + partition_remap_index);
LAB_0026fc93:
            uVar12 = (ulong)partition_remap_index;
            bVar2 = bsd->texel_count;
            puVar1 = canonical_patterns + partition_remap_index * 7;
            puVar1[3] = 0;
            puVar1[4] = 0;
            puVar1[5] = 0;
            puVar1[6] = 0;
            *puVar1 = 0;
            puVar1[1] = 0;
            puVar1[2] = 0;
            puVar1[3] = 0;
            local_448 = vpcmpeqd_avx((undefined1  [16])0x0,(undefined1  [16])0x0);
            if ((ulong)bVar2 != 0) {
              bVar7 = 0;
              uVar8 = 0;
              iVar10 = 0;
              do {
                iVar5 = *(int *)(local_448 + (ulong)ptab[uVar12].partition_of_texel[uVar8] * 4);
                if (*(int *)(local_448 + (ulong)ptab[uVar12].partition_of_texel[uVar8] * 4) < 0) {
                  *(int *)(local_448 + (ulong)ptab[uVar12].partition_of_texel[uVar8] * 4) = iVar10;
                  iVar5 = iVar10;
                  iVar10 = iVar10 + 1;
                }
                puVar1[uVar8 >> 5 & 0x7ffffff] =
                     puVar1[uVar8 >> 5 & 0x7ffffff] | (long)iVar5 << (bVar7 & 0x3e);
                uVar8 = uVar8 + 1;
                bVar7 = bVar7 + 2;
              } while (bVar2 != uVar8);
            }
            if (partition_remap_index == 0) {
              bVar14 = false;
            }
            else {
              bVar14 = true;
              uVar9 = 0;
              uVar8 = 1;
              do {
                uVar11 = uVar9 & 0xffffffff;
                if (((((*puVar1 == canonical_patterns[uVar11]) &&
                      (puVar1[1] == canonical_patterns[uVar11 + 1])) &&
                     (puVar1[2] == canonical_patterns[uVar11 + 2])) &&
                    ((puVar1[3] == canonical_patterns[uVar11 + 3] &&
                     (puVar1[4] == canonical_patterns[uVar11 + 4])))) &&
                   ((puVar1[5] == canonical_patterns[uVar11 + 5] &&
                    (puVar1[6] == canonical_patterns[uVar11 + 6])))) break;
                bVar14 = uVar8 < uVar12;
                uVar9 = uVar9 + 7;
                bVar15 = uVar8 != uVar12;
                uVar8 = uVar8 + 1;
              } while (bVar15);
            }
            if ((bVar14) || (bVar3 != true)) {
              if (iVar13 == 1) {
                bsd->partitioning_packed_index[partition_count - 2][lVar6] =
                     (uint16_t)partition_remap_index;
                bsd->partitioning_count_all[uVar4] = bsd->partitioning_count_all[uVar4] + 1;
                goto LAB_0026fde5;
              }
            }
            else if (iVar13 == 0) {
              bsd->partitioning_packed_index[partition_count - 2][lVar6] =
                   (uint16_t)partition_remap_index;
              bsd->partitioning_count_selected[uVar4] = bsd->partitioning_count_selected[uVar4] + 1;
              bsd->partitioning_count_all[uVar4] = bsd->partitioning_count_all[uVar4] + 1;
              local_438[lVar6] = '\x01';
LAB_0026fde5:
              partition_remap_index = partition_remap_index + 1;
            }
          }
        }
        else {
          bVar3 = generate_one_partition_info_entry
                            (bsd,partition_count,(uint)lVar6,partition_remap_index,
                             ptab + partition_remap_index);
          if ((iVar13 != 0) || (bVar3)) goto LAB_0026fc93;
        }
        lVar6 = lVar6 + 1;
      } while (lVar6 != 0x400);
      iVar13 = iVar13 + 1;
    } while (iVar13 != local_46c);
  }
  return;
}

Assistant:

static void build_partition_table_for_one_partition_count(
	block_size_descriptor& bsd,
	bool can_omit_partitionings,
	unsigned int partition_count_cutoff,
	unsigned int partition_count,
	partition_info* ptab,
	uint64_t* canonical_patterns
) {
	unsigned int next_index = 0;
	bsd.partitioning_count_selected[partition_count - 1] = 0;
	bsd.partitioning_count_all[partition_count - 1] = 0;

	// Skip tables larger than config max partition count if we can omit modes
	if (can_omit_partitionings && (partition_count > partition_count_cutoff))
	{
		return;
	}

	// Iterate through twice
	//   - Pass 0: Keep selected partitionings
	//   - Pass 1: Keep non-selected partitionings (skip if in omit mode)
	unsigned int max_iter = can_omit_partitionings ? 1 : 2;

	// Tracker for things we built in the first iteration
	uint8_t build[BLOCK_MAX_PARTITIONINGS] { 0 };
	for (unsigned int x = 0; x < max_iter; x++)
	{
		for (unsigned int i = 0; i < BLOCK_MAX_PARTITIONINGS; i++)
		{
			// Don't include things we built in the first pass
			if ((x == 1) && build[i])
			{
				continue;
			}

			bool keep_useful = generate_one_partition_info_entry(bsd, partition_count, i, next_index, ptab[next_index]);
			if ((x == 0) && !keep_useful)
			{
				continue;
			}

			generate_canonical_partitioning(bsd.texel_count, ptab[next_index].partition_of_texel, canonical_patterns + next_index * BIT_PATTERN_WORDS);
			bool keep_canonical = true;
			for (unsigned int j = 0; j < next_index; j++)
			{
				bool match = compare_canonical_partitionings(canonical_patterns + next_index * BIT_PATTERN_WORDS, canonical_patterns +  j * BIT_PATTERN_WORDS);
				if (match)
				{
					keep_canonical = false;
					break;
				}
			}

			if (keep_useful && keep_canonical)
			{
				if (x == 0)
				{
					bsd.partitioning_packed_index[partition_count - 2][i] = static_cast<uint16_t>(next_index);
					bsd.partitioning_count_selected[partition_count - 1]++;
					bsd.partitioning_count_all[partition_count - 1]++;
					build[i] = 1;
					next_index++;
				}
			}
			else
			{
				if (x == 1)
				{
					bsd.partitioning_packed_index[partition_count - 2][i] = static_cast<uint16_t>(next_index);
					bsd.partitioning_count_all[partition_count - 1]++;
					next_index++;
				}
			}
		}
	}
}